

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

id_t __thiscall libchars::validation::get_vtype_by_name(validation *this,char *name)

{
  size_t sVar1;
  iterator iVar2;
  _Rb_tree_color _Var3;
  key_type local_50;
  
  _Var3 = _S_red;
  if (name != (char *)0x0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    sVar1 = strlen(name);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,name,name + sVar1);
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    *)this,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    _Var3 = _S_red;
    if ((_Rb_tree_header *)iVar2._M_node != &(this->n2i)._M_t._M_impl.super__Rb_tree_header) {
      _Var3 = iVar2._M_node[2]._M_color;
    }
  }
  return _Var3;
}

Assistant:

const validator::id_t validation::get_vtype_by_name(const char *name)
    {
        if (name == NULL)
            return validator::NONE;

        vtype_by_name_t::const_iterator ni = n2i.find(name);
        if (ni != n2i.end())
            return ni->second;
        else
            return validator::NONE;
    }